

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  DbPage *pDbPage;
  PgHdr *local_30;
  
  if (*pRC != 0) {
    return;
  }
  if (key == 1) {
    uVar4 = 0;
  }
  else {
    if (key == 0) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xec56,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      *pRC = 0xb;
      return;
    }
    iVar2 = (key - 2) - (key - 2) % (pBt->usableSize / 5 + 1);
    uVar4 = iVar2 + (uint)(iVar2 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  iVar2 = (*pBt->pPager->xGet)(pBt->pPager,uVar4,&local_30,0);
  if (iVar2 == 0) {
    uVar4 = (~uVar4 + key) * 5;
    if ((int)uVar4 < 0) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xec61,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      *pRC = 0xb;
    }
    else {
      pvVar1 = local_30->pData;
      uVar3 = (ulong)uVar4;
      if ((*(u8 *)((long)pvVar1 + uVar3) != eType) ||
         (uVar4 = *(uint *)((long)pvVar1 + uVar3 + 1),
         (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) != parent
         )) {
        iVar2 = sqlite3PagerWrite(local_30);
        *pRC = iVar2;
        if (iVar2 == 0) {
          *(u8 *)((long)pvVar1 + uVar3) = eType;
          *(char *)((long)pvVar1 + uVar3 + 1) = (char)(parent >> 0x18);
          *(char *)((long)pvVar1 + uVar3 + 2) = (char)(parent >> 0x10);
          *(char *)((long)pvVar1 + uVar3 + 3) = (char)(parent >> 8);
          *(char *)((long)pvVar1 + uVar3 + 4) = (char)parent;
        }
      }
    }
    if (local_30 != (DbPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_30);
    }
  }
  else {
    *pRC = iVar2;
  }
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The master-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %d->(%d,%d)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}